

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration(void)

{
  long lVar1;
  QSharedDataPointer<QSslConfigurationPrivate> in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> locker;
  QSslConfigurationPrivate *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSslSocketPrivate::ensureInitialized();
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             in_stack_ffffffffffffffb8);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_RDI.d.ptr,(QMutex *)in_stack_ffffffffffffffb8);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_globalData>_> *)
             in_stack_ffffffffffffffb8);
  QExplicitlySharedDataPointer<QSslConfigurationPrivate>::data
            ((QExplicitlySharedDataPointer<QSslConfigurationPrivate> *)0x3a6132);
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)in_RDI.d.ptr,in_stack_ffffffffffffffb8);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_RDI.d.ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QSharedDataPointer<QSslConfigurationPrivate>)
           (QSharedDataPointer<QSslConfigurationPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QSslConfiguration QSslConfigurationPrivate::defaultDtlsConfiguration()
{
    QSslSocketPrivate::ensureInitialized();
    QMutexLocker locker(&globalData()->mutex);

    return QSslConfiguration(globalData()->dtlsConfig.data());
}